

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall DifferingTypesTest::assignmentTest(DifferingTypesTest *this)

{
  short sVar1;
  short sVar2;
  int iVar3;
  reference psVar4;
  reference pfVar5;
  reference piVar6;
  reference psVar7;
  logic_error *plVar8;
  runtime_error *this_00;
  ulong uVar9;
  size_t sVar10;
  size_t shape [3];
  View<short,_false,_std::allocator<unsigned_long>_> v;
  size_t shape_1 [3];
  undefined1 local_f8 [8];
  geometry_type gStack_f0;
  undefined1 local_b0 [16];
  size_t *local_a0;
  size_t local_88;
  ulong local_80;
  unsigned_long local_68 [3];
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  local_50;
  short *local_38;
  
  local_f8 = (undefined1  [8])0x3;
  gStack_f0._0_8_ = 2;
  gStack_f0.shape_ = (size_t *)0x4;
  local_b0._0_8_ = this->dataShort_;
  local_38 = (short *)local_b0._0_8_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b0 + 8),(unsigned_long *)local_f8,
             (unsigned_long *)(local_f8 + 0x18),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_68);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_b0);
  local_68[0] = CONCAT62(local_68[0]._2_6_,2);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::operator=
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_b0,(short *)local_68);
  if (local_80 != 0) {
    sVar10 = 0;
    do {
      psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<short,_false,_std::allocator<unsigned_long>_> *)local_b0,sVar10);
      if (*psVar4 != 2) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 < local_80);
  }
  operator_delete(local_a0,local_88 * 0x18);
  local_68[0] = 3;
  local_68[1] = 2;
  local_68[2] = 4;
  local_b0._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b0 + 8),local_68,
             (unsigned_long *)&local_50,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
  local_f8 = (undefined1  [8])0x0;
  gStack_f0.shape_ = (size_t *)0x0;
  gStack_f0.shapeStrides_ = (size_t *)0x0;
  gStack_f0.strides_ = (size_t *)0x0;
  gStack_f0.dimension_ = 0;
  gStack_f0.size_ = 0;
  gStack_f0.coordinateOrder_ = LastMajorOrder;
  gStack_f0.isSimple_ = true;
  andres::View<float,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_true,_std::allocator<unsigned_long>_> *)local_f8);
  andres::View<float,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_true,_std::allocator<unsigned_long>_> *)local_f8);
  andres::marray_detail::
  AssignmentOperatorHelper<true,_int,_float,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
  ::execute<false>((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0,
                   (View<float,_true,_std::allocator<unsigned_long>_> *)local_f8);
  andres::View<float,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_true,_std::allocator<unsigned_long>_> *)local_f8);
  if (local_80 != 0) {
    sVar10 = 0;
    do {
      pfVar5 = andres::View<float,_true,_std::allocator<unsigned_long>_>::operator()
                         ((View<float,_true,_std::allocator<unsigned_long>_> *)local_f8,sVar10);
      if ((*pfVar5 != (float)this->dataInt_[sVar10]) ||
         (NAN(*pfVar5) || NAN((float)this->dataInt_[sVar10]))) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 < local_80);
  }
  operator_delete(gStack_f0.shape_,gStack_f0.dimension_ * 0x18);
  operator_delete(local_a0,local_88 * 0x18);
  local_68[0] = 3;
  local_68[1] = 2;
  local_68[2] = 4;
  local_b0._0_8_ = local_38;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b0 + 8),local_68,
             (unsigned_long *)&local_50,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_f8);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_b0);
  local_f8 = (undefined1  [8])this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),local_68,
             (unsigned_long *)&local_50,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_50);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  andres::
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  ::BinaryViewExpression
            (&local_50,
             (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
             local_b0,(ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                       *)local_b0);
  andres::marray_detail::
  operate<andres::marray_detail::Assign<int,short>,int,std::allocator<unsigned_long>,andres::BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>,short>
            (local_f8,&local_50);
  if (gStack_f0.size_ != 0) {
    sVar10 = 0;
    do {
      piVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,sVar10);
      iVar3 = *piVar6;
      andres::
      BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
      ::BinaryViewExpression
                (&local_50,
                 (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                  *)local_b0,
                 (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                  *)local_b0);
      psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         (local_50.e1_,sVar10);
      psVar7 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         (local_50.e2_,sVar10);
      if (iVar3 != (short)(*psVar7 + *psVar4)) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 < gStack_f0.size_);
  }
  operator_delete(gStack_f0.shape_,gStack_f0.dimension_ * 0x18);
  operator_delete(local_a0,local_88 * 0x18);
  local_f8 = (undefined1  [8])0x3;
  gStack_f0._0_8_ = 2;
  gStack_f0.shape_ = (size_t *)0x4;
  local_68[0] = local_68[0] & 0xffffffffffff0000;
  andres::Marray<short,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<short,std::allocator<unsigned_long>> *)local_b0,(unsigned_long *)local_f8,
             (unsigned_long *)(local_f8 + 0x18),(short *)local_68,&andres::defaultOrder,
             (allocator_type *)&local_50);
  if ((short *)local_b0._0_8_ == (short *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_80 != 0) {
    uVar9 = 0;
    do {
      *(short *)(local_b0._0_8_ + uVar9 * 2) = 2;
      uVar9 = uVar9 + 1;
    } while (local_80 != uVar9);
  }
  if (local_80 != 0) {
    sVar10 = 0;
    do {
      psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<short,_false,_std::allocator<unsigned_long>_> *)local_b0,sVar10);
      if (*psVar4 != 2) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 < local_80);
  }
  operator_delete((void *)local_b0._0_8_,local_80 * 2);
  operator_delete(local_a0,local_88 * 0x18);
  local_68[0] = 3;
  local_68[1] = 2;
  local_68[2] = 4;
  local_f8 = (undefined1  [8])local_38;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),local_68,
             (unsigned_long *)&local_50,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_f8);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_b0,(allocator_type *)&local_50);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_b0,
             (View<short,_false,_std::allocator<unsigned_long>_> *)local_f8);
  if (gStack_f0.size_ != local_80) {
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar8,"test failed.");
    __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (gStack_f0.size_ != 0) {
    sVar10 = 0;
    do {
      psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<short,_false,_std::allocator<unsigned_long>_> *)local_f8,sVar10);
      sVar1 = *psVar4;
      piVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0,sVar10);
      if (*piVar6 != (int)sVar1) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 < gStack_f0.size_);
  }
  operator_delete((void *)local_b0._0_8_,local_80 << 2);
  operator_delete(local_a0,local_88 * 0x18);
  operator_delete(gStack_f0.shape_,gStack_f0.dimension_ * 0x18);
  local_68[0] = 3;
  local_68[1] = 2;
  local_68[2] = 4;
  local_f8 = (undefined1  [8])local_38;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),local_68,
             (unsigned_long *)&local_50,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_b0);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_f8);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_b0,(allocator_type *)&local_50);
  andres::
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  ::BinaryViewExpression
            (&local_50,
             (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
             local_f8,(ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                       *)local_f8);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)local_b0,
             (ViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>,_short>
              *)&local_50);
  if (gStack_f0.size_ == local_80) {
    if (gStack_f0.size_ != 0) {
      sVar10 = 0;
      do {
        psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                           ((View<short,_false,_std::allocator<unsigned_long>_> *)local_f8,sVar10);
        sVar1 = *psVar4;
        psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                           ((View<short,_false,_std::allocator<unsigned_long>_> *)local_f8,sVar10);
        sVar2 = *psVar4;
        piVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0,sVar10);
        if ((int)sVar2 + (int)sVar1 != *piVar6) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 < gStack_f0.size_);
    }
    operator_delete((void *)local_b0._0_8_,local_80 << 2);
    operator_delete(local_a0,local_88 * 0x18);
    operator_delete(gStack_f0.shape_,gStack_f0.dimension_ * 0x18);
    local_68[0] = 3;
    local_68[1] = 2;
    local_68[2] = 4;
    local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffffffff0000);
    andres::Marray<short,std::allocator<unsigned_long>>::Marray<unsigned_long*>
              ((Marray<short,std::allocator<unsigned_long>> *)local_b0,local_68,
               (unsigned_long *)&local_50,(short *)local_f8,&andres::defaultOrder,
               (allocator_type *)&local_50);
    andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
              ((Marray<int,_std::allocator<unsigned_long>_> *)local_f8,(allocator_type *)&local_50);
    andres::Marray<int,std::allocator<unsigned_long>>::operator=
              ((Marray<int,std::allocator<unsigned_long>> *)local_f8,
               (View<short,_false,_std::allocator<unsigned_long>_> *)local_b0);
    if (gStack_f0.size_ == local_80) {
      if (gStack_f0.size_ != 0) {
        sVar10 = 0;
        do {
          piVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                             ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f8,sVar10);
          iVar3 = *piVar6;
          psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                             ((View<short,_false,_std::allocator<unsigned_long>_> *)local_b0,sVar10)
          ;
          if (iVar3 != *psVar4) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar8,"test failed.");
            __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          sVar10 = sVar10 + 1;
        } while (sVar10 < gStack_f0.size_);
      }
      operator_delete((void *)local_f8,gStack_f0.size_ << 2);
      operator_delete(gStack_f0.shape_,gStack_f0.dimension_ * 0x18);
      operator_delete((void *)local_b0._0_8_,local_80 * 2);
      operator_delete(local_a0,local_88 * 0x18);
      return;
    }
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar8,"test failed.");
    __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar8,"test failed.");
  __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void DifferingTypesTest::assignmentTest()
{
    // View
    {
        // from constant
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            v = 2;
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == 2);
            }
        }
        // from View
        { 
            // compilers may issue a warning here
            if(sizeof(float) == sizeof(int)) {
                std::size_t shape[] = {3, 2, 4};
                andres::View<int> v(shape, shape+3, dataInt_);
                andres::View<float, true> w;
                w = v;
                for(std::size_t j=0; j<v.size(); ++j) {
                    test( w(j) == *static_cast<float*>(
                        static_cast<void*>(&dataInt_[j])));
                }
            }
        }
        // from ViewExpression
        { 
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::View<int> w(shape, shape+3, dataInt_);
            w = v + v;
            for(std::size_t j=0; j<w.size(); ++j) {
                test(w(j) == (v + v)(j));
            }
        }
    }
    // Marray
    {
        // from constant
        {
            std::size_t shape[] = {3, 2, 4};
            andres::Marray<short> m(shape, shape+3);
            m = 2;
            for(std::size_t j=0; j<m.size(); ++j) {
                test(m(j) == 2);
            }
        }
        // from View 
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m;
            m = v;
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == m(j));
            }
        }
        // from ViewExpression
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m;
            m = v + v;
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j)+v(j) == m(j));
            }
        }
        // from Marray
        {
            std::size_t shape[] = {3, 2, 4};
            andres::Marray<short> m(shape, shape+3);
            andres::Marray<int> n;
            n = m;
            test(n.size() == m.size());
            for(std::size_t j=0; j<n.size(); ++j) {
                test(n(j) == m(j));
            }
        }
    }
}